

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::TightenBoundsPS::execute
          (TightenBoundsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  VarStatus VVar2;
  int iVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  VarStatus *pVVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_3f8;
  cpp_dec_float<50U,_int,_void> local_3c0;
  cpp_dec_float<50U,_int,_void> local_388;
  cpp_dec_float<50U,_int,_void> local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  cpp_dec_float<50U,_int,_void> local_298;
  cpp_dec_float<50U,_int,_void> local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  cpp_dec_float<50U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar12 = this->m_j;
  VVar2 = cStatus->data[iVar12];
  if (VVar2 == ON_UPPER) {
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
    local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
    local_2d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
    puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
    local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_2d8.m_backend.exp = pnVar4[iVar12].m_backend.exp;
    local_2d8.m_backend.neg = pnVar4[iVar12].m_backend.neg;
    local_2d8.m_backend.fpclass = pnVar4[iVar12].m_backend.fpclass;
    local_2d8.m_backend.prec_elem = pnVar4[iVar12].m_backend.prec_elem;
    local_318.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
    local_318.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
    local_318.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
    local_318.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
    local_318.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
    local_318.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
    local_318.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
    local_318.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
    local_318.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
    local_318.m_backend.exp = (this->m_origupper).m_backend.exp;
    local_318.m_backend.neg = (this->m_origupper).m_backend.neg;
    local_318.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
    local_318.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
    bVar11 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_2d8,&local_318,&local_d8);
    if (!bVar11) {
      return;
    }
  }
  else {
    if (VVar2 == ON_LOWER) {
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
      uVar10 = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
      uVar6 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
      puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      iVar3 = pnVar4[iVar12].m_backend.exp;
      bVar11 = pnVar4[iVar12].m_backend.neg;
      uVar7._0_4_ = pnVar4[iVar12].m_backend.fpclass;
      uVar7._4_4_ = pnVar4[iVar12].m_backend.prec_elem;
      local_298.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
      local_298.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
      local_298.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
      local_298.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
      local_298.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
      local_298.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
      local_298.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
      local_298.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
      local_298.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
      local_298.exp = (this->m_origlower).m_backend.exp;
      local_298.neg = (this->m_origlower).m_backend.neg;
      local_298.fpclass = (this->m_origlower).m_backend.fpclass;
      local_298.prec_elem = (this->m_origlower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_3c0,this);
      local_3f8.data._M_elems._0_8_ = uVar10;
      local_3f8.data._M_elems._8_8_ = uVar6;
      local_3f8.data._M_elems._16_8_ = uVar8;
      local_3f8.data._M_elems._24_8_ = uVar9;
      local_3f8.data._M_elems._32_8_ = uVar5;
      local_3f8.exp = iVar3;
      local_3f8.neg = bVar11;
      local_3f8._48_8_ = uVar7;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3f8,&local_298);
      if (local_3f8.fpclass == cpp_dec_float_NaN) {
        return;
      }
      if (local_3c0.fpclass == cpp_dec_float_NaN) {
        return;
      }
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_3f8,&local_3c0);
      if (iVar12 < 1) {
        return;
      }
      iVar12 = this->m_j;
      pVVar13 = cStatus->data;
      goto LAB_00336ec5;
    }
    if (VVar2 != FIXED) {
      return;
    }
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
    local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
    local_118.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
    puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
    local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_118.m_backend.exp = pnVar4[iVar12].m_backend.exp;
    local_118.m_backend.neg = pnVar4[iVar12].m_backend.neg;
    local_118.m_backend.fpclass = pnVar4[iVar12].m_backend.fpclass;
    local_118.m_backend.prec_elem = pnVar4[iVar12].m_backend.prec_elem;
    local_158.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
    local_158.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
    local_158.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
    local_158.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
    local_158.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
    local_158.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
    local_158.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
    local_158.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
    local_158.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
    local_158.m_backend.exp = (this->m_origupper).m_backend.exp;
    local_158.m_backend.neg = (this->m_origupper).m_backend.neg;
    local_158.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
    local_158.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_68,this);
    bVar11 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_118,&local_158,&local_68);
    if (!bVar11) {
LAB_00336c33:
      iVar12 = this->m_j;
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1d8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
      local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
      local_1d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
      puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
      local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1d8.m_backend.exp = pnVar4[iVar12].m_backend.exp;
      local_1d8.m_backend.neg = pnVar4[iVar12].m_backend.neg;
      local_1d8.m_backend.fpclass = pnVar4[iVar12].m_backend.fpclass;
      local_1d8.m_backend.prec_elem = pnVar4[iVar12].m_backend.prec_elem;
      local_218.m_backend.data._M_elems[0] = (this->m_origupper).m_backend.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = (this->m_origupper).m_backend.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = (this->m_origupper).m_backend.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = (this->m_origupper).m_backend.data._M_elems[3];
      local_218.m_backend.data._M_elems[4] = (this->m_origupper).m_backend.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = (this->m_origupper).m_backend.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = (this->m_origupper).m_backend.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = (this->m_origupper).m_backend.data._M_elems[7];
      local_218.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_origupper).m_backend.data._M_elems + 8);
      local_218.m_backend.exp = (this->m_origupper).m_backend.exp;
      local_218.m_backend.neg = (this->m_origupper).m_backend.neg;
      local_218.m_backend.fpclass = (this->m_origupper).m_backend.fpclass;
      local_218.m_backend.prec_elem = (this->m_origupper).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
      bVar11 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_1d8,&local_218,&local_a0);
      iVar12 = this->m_j;
      if (bVar11) {
        cStatus->data[iVar12] = ON_LOWER;
        return;
      }
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
      uVar10 = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
      uVar7 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
      puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      iVar3 = pnVar4[iVar12].m_backend.exp;
      bVar11 = pnVar4[iVar12].m_backend.neg;
      uVar6._0_4_ = pnVar4[iVar12].m_backend.fpclass;
      uVar6._4_4_ = pnVar4[iVar12].m_backend.prec_elem;
      local_258.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
      local_258.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
      local_258.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
      local_258.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
      local_258.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
      local_258.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
      local_258.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
      local_258.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
      local_258.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
      local_258.exp = (this->m_origlower).m_backend.exp;
      local_258.neg = (this->m_origlower).m_backend.neg;
      local_258.fpclass = (this->m_origlower).m_backend.fpclass;
      local_258.prec_elem = (this->m_origlower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_388,this);
      local_3f8.data._M_elems._0_8_ = uVar10;
      local_3f8.data._M_elems._8_8_ = uVar7;
      local_3f8.data._M_elems._16_8_ = uVar8;
      local_3f8.data._M_elems._24_8_ = uVar9;
      local_3f8.data._M_elems._32_8_ = uVar5;
      local_3f8.exp = iVar3;
      local_3f8.neg = bVar11;
      local_3f8._48_8_ = uVar6;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_3f8,&local_258);
      if (local_3f8.fpclass == cpp_dec_float_NaN) {
        return;
      }
      if (local_388.fpclass == cpp_dec_float_NaN) {
        return;
      }
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_3f8,&local_388);
      if (iVar12 < 1) {
        return;
      }
      cStatus->data[this->m_j] = ON_UPPER;
      return;
    }
    iVar12 = this->m_j;
    pnVar4 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 8);
    uVar6 = *(undefined8 *)&pnVar4[iVar12].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar4[iVar12].m_backend.data._M_elems + 2);
    puVar1 = pnVar4[iVar12].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    iVar3 = pnVar4[iVar12].m_backend.exp;
    bVar11 = pnVar4[iVar12].m_backend.neg;
    uVar10._0_4_ = pnVar4[iVar12].m_backend.fpclass;
    uVar10._4_4_ = pnVar4[iVar12].m_backend.prec_elem;
    local_198.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_origlower).m_backend.data._M_elems + 8);
    local_198.data._M_elems[0] = (this->m_origlower).m_backend.data._M_elems[0];
    local_198.data._M_elems[1] = (this->m_origlower).m_backend.data._M_elems[1];
    local_198.data._M_elems[2] = (this->m_origlower).m_backend.data._M_elems[2];
    local_198.data._M_elems[3] = (this->m_origlower).m_backend.data._M_elems[3];
    local_198.data._M_elems[4] = (this->m_origlower).m_backend.data._M_elems[4];
    local_198.data._M_elems[5] = (this->m_origlower).m_backend.data._M_elems[5];
    local_198.data._M_elems[6] = (this->m_origlower).m_backend.data._M_elems[6];
    local_198.data._M_elems[7] = (this->m_origlower).m_backend.data._M_elems[7];
    local_198.exp = (this->m_origlower).m_backend.exp;
    local_198.neg = (this->m_origlower).m_backend.neg;
    local_198.fpclass = (this->m_origlower).m_backend.fpclass;
    local_198.prec_elem = (this->m_origlower).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_350,this);
    local_3f8.data._M_elems._0_8_ = uVar6;
    local_3f8.data._M_elems._8_8_ = uVar7;
    local_3f8.data._M_elems._16_8_ = uVar8;
    local_3f8.data._M_elems._24_8_ = uVar9;
    local_3f8.data._M_elems._32_8_ = uVar5;
    local_3f8.exp = iVar3;
    local_3f8.neg = bVar11;
    local_3f8._48_8_ = uVar10;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&local_3f8,&local_198);
    if (((local_3f8.fpclass == cpp_dec_float_NaN) || (local_350.fpclass == cpp_dec_float_NaN)) ||
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_3f8,&local_350), iVar12 < 1)) goto LAB_00336c33;
  }
  iVar12 = this->m_j;
  pVVar13 = cStatus->data;
LAB_00336ec5:
  pVVar13[iVar12] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::TightenBoundsPS::execute(VectorBase<R>& x, VectorBase<R>&, VectorBase<R>&,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // basis:
   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(LT(x[m_j], m_origupper, this->feastol()) && GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
      else if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;

      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}